

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::timeRequest
          (TimeCoordinator *this,Time nextTime,IterationRequest iterate,Time newValueTime,
          Time newMessageTime)

{
  initializer_list<TimeRepresentation<count_time<9,_long>_>_> __l;
  bool bVar1;
  Time TVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  undefined1 in_DL;
  pointer in_RSI;
  TimeDependencies *in_RDI;
  TimeCoordinator *in_stack_00000178;
  GlobalFederateId in_stack_00000184;
  TimeDependencies *local_a8;
  TimeDependencies *in_stack_ffffffffffffff60;
  pointer *in_stack_ffffffffffffff68;
  pointer *local_90;
  Time in_stack_ffffffffffffff80;
  TimeCoordinator *in_stack_ffffffffffffff98;
  TimeCoordinator *in_stack_ffffffffffffffb0;
  Time in_stack_ffffffffffffffb8;
  undefined1 local_18 [16];
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  *(undefined1 *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) = in_DL;
  local_8.internalTimeCode = (baseType)in_RSI;
  if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) == '\0') {
    TVar2 = getNextPossibleTime(in_stack_ffffffffffffff98);
    in_RDI[10].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)TVar2.internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_8,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10));
    if (bVar1) {
      local_8.internalTimeCode =
           (baseType)
           in_RDI[10].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (((ulong)in_RDI[0x12].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) {
      TVar2 = generateAllowedTime(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
      in_RDI[10].dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)TVar2.internalTimeCode;
    }
  }
  else {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_8,(TimeRepresentation<count_time<9,_long>_> *)
                                &in_RDI[9].dependencies.
                                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar1) || (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) == '\x01')) {
      local_8.internalTimeCode =
           (baseType)
           in_RDI[9].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  *(baseType *)&in_RDI[9].mDelayedDependency = local_8.internalTimeCode;
  if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) == '\0') {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)(local_18 + 8),
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10));
    if (bVar1) {
      in_stack_ffffffffffffff60 = (TimeDependencies *)(local_18 + 8);
    }
    else {
      in_stack_ffffffffffffff60 = in_RDI + 10;
    }
    in_RDI[0xb].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (in_stack_ffffffffffffff60->dependencies).
         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl
         .super__Vector_impl_data._M_start;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)local_18,
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10));
    if (bVar1) {
      local_a8 = (TimeDependencies *)local_18;
    }
    else {
      local_a8 = in_RDI + 10;
    }
    in_RDI[0xb].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (local_a8->dependencies).
         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl
         .super__Vector_impl_data._M_start;
  }
  else {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)(local_18 + 8),
                       (TimeRepresentation<count_time<9,_long>_> *)
                       &in_RDI[9].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      local_90 = (pointer *)(local_18 + 8);
    }
    else {
      local_90 = &in_RDI[9].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    in_RDI[0xb].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *local_90;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)local_18,
                       (TimeRepresentation<count_time<9,_long>_> *)
                       &in_RDI[9].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      in_stack_ffffffffffffff68 = (pointer *)local_18;
    }
    else {
      in_stack_ffffffffffffff68 =
           &in_RDI[9].dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    in_RDI[0xb].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = *in_stack_ffffffffffffff68;
  }
  __l._M_len = (size_type)in_stack_ffffffffffffff68;
  __l._M_array = (iterator)in_stack_ffffffffffffff60;
  TVar3 = std::min<TimeRepresentation<count_time<9,long>>>(__l);
  in_RDI[0xb].dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)TVar3.internalTimeCode;
  if ((((ulong)in_RDI[0x12].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) &&
     ((bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xb),
                          (TimeRepresentation<count_time<9,_long>_> *)
                          &in_RDI[9].dependencies.
                           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1 ||
      (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) == '\0')))) {
    in_RDI[0xb].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)&in_RDI[9].mDelayedDependency;
  }
  TimeDependencies::resetDependentEvents(in_RDI,in_stack_ffffffffffffff80);
  *(int *)((long)&in_RDI[2].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) =
       *(int *)((long)&in_RDI[2].dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
  (*(code *)(((in_RDI->dependencies).
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_TimeData).minDe.internalTimeCode)();
  bVar1 = TimeDependencies::empty((TimeDependencies *)0x615ebe);
  if (!bVar1) {
    memset(&stack0xffffffffffffff84,0,4);
    GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff84);
    sendTimeRequest(in_stack_00000178,in_stack_00000184);
  }
  return;
}

Assistant:

void TimeCoordinator::timeRequest(Time nextTime,
                                  IterationRequest iterate,
                                  Time newValueTime,
                                  Time newMessageTime)
{
    iterating = iterate;

    if (iterating != IterationRequest::NO_ITERATIONS) {
        if (nextTime < time_granted || iterating == IterationRequest::FORCE_ITERATION) {
            nextTime = time_granted;
        }
    } else {
        time_next = getNextPossibleTime();
        if (nextTime < time_next) {
            nextTime = time_next;
        }
        if (info.uninterruptible) {
            time_next = generateAllowedTime(nextTime);
        }
    }
    time_requested = nextTime;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        time_value = (newValueTime > time_granted) ? newValueTime : time_granted;
        time_message = (newMessageTime > time_granted) ? newMessageTime : time_granted;
    } else {
        time_value = (newValueTime > time_next) ? newValueTime : time_next;
        time_message = (newMessageTime > time_next) ? newMessageTime : time_next;
    }

    time_exec = std::min({time_value, time_message, time_requested});
    if (info.uninterruptible) {
        if (time_exec > time_granted || iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = time_requested;
        }
    }
    dependencies.resetDependentEvents(time_granted);
    ++sequenceCounter;
    updateTimeFactors();

    if (!dependencies.empty()) {
        sendTimeRequest(GlobalFederateId{});
    }
}